

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
::MergePartialFromCodedStream
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
           *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 tag;
  uint uVar5;
  uint32 first_byte_or_zero;
  string *psVar6;
  
LAB_004518c6:
  do {
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      tag = (uint32)bVar1;
      first_byte_or_zero = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_004518e1;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_004518e1:
      tag = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    if (tag == 10) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      psVar6 = (this->key_).ptr_;
      if (psVar6 == (string *)&fixed_address_empty_string_abi_cxx11_) {
        ArenaStringPtr::CreateInstance
                  (&this->key_,this->arena_,(string *)&fixed_address_empty_string_abi_cxx11_);
        psVar6 = (this->key_).ptr_;
      }
      bVar4 = WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar4) {
        return false;
      }
      uVar5 = this->_has_bits_[0] | 1;
      this->_has_bits_[0] = uVar5;
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (*puVar3 == '\x12')) {
        input->buffer_ = puVar3 + 1;
LAB_0045197d:
        this->_has_bits_[0] = uVar5 | 2;
        psVar6 = (this->value_).ptr_;
        if (psVar6 == (string *)&fixed_address_empty_string_abi_cxx11_) {
          ArenaStringPtr::CreateInstance
                    (&this->value_,this->arena_,(string *)&fixed_address_empty_string_abi_cxx11_);
          psVar6 = (this->value_).ptr_;
        }
        bVar4 = WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar4) {
          return false;
        }
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
        if ((input->buffer_ == input->buffer_end_) &&
           ((input->buffer_size_after_limit_ != 0 ||
            (input->total_bytes_read_ == input->current_limit_)))) {
          input->last_tag_ = 0;
          input->legitimate_message_end_ = true;
          return true;
        }
      }
      goto LAB_004518c6;
    }
    if (tag == 0x12) {
      uVar5 = this->_has_bits_[0];
      goto LAB_0045197d;
    }
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    bVar4 = WireFormatLite::SkipField(input,tag);
    if (!bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool MergePartialFromCodedStream(::google::protobuf::io::CodedInputStream* input) {
    uint32 tag;

    for (;;) {
      // 1) corrupted data: return false;
      // 2) unknown field: skip without putting into unknown field set;
      // 3) unknown enum value: keep it in parsing. In proto2, caller should
      // check the value and put this entry into containing message's unknown
      // field set if the value is an unknown enum. In proto3, caller doesn't
      // need to care whether the value is unknown enum;
      // 4) missing key/value: missed key/value will have default value. caller
      // should take this entry as if key/value is set to default value.
      tag = input->ReadTagNoLastTag();
      switch (tag) {
        case kKeyTag:
          if (!KeyTypeHandler::Read(input, mutable_key())) {
            return false;
          }
          set_has_key();
          if (!input->ExpectTag(kValueTag)) break;
          GOOGLE_FALLTHROUGH_INTENDED;

        case kValueTag:
          if (!ValueTypeHandler::Read(input, mutable_value())) {
            return false;
          }
          set_has_value();
          if (input->ExpectAtEnd()) return true;
          break;

        default:
          if (tag == 0 ||
              WireFormatLite::GetTagWireType(tag) ==
              WireFormatLite::WIRETYPE_END_GROUP) {
            return true;
          }
          if (!WireFormatLite::SkipField(input, tag)) return false;
          break;
      }
    }
  }